

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_instid(lyd_node *data,char *path,int req_inst,lyd_node **ret)

{
  int iVar1;
  undefined1 local_b8 [8];
  unres_data node_match;
  uint local_88;
  int has_predicate;
  int name_len;
  int mod_len;
  char *str;
  char *name;
  char *model;
  lyd_node *node;
  lyd_node *root;
  ly_ctx *ctx;
  lys_module *prev_mod;
  lys_module *mod;
  int cur_idx;
  int parsed;
  int j;
  int i;
  lyd_node **ret_local;
  char *pcStack_20;
  int req_inst_local;
  char *path_local;
  lyd_node *data_local;
  
  parsed = 0;
  ctx = (ly_ctx *)0x0;
  root = (lyd_node *)data->schema->module->ctx;
  name = (char *)0x0;
  _j = ret;
  ret_local._4_4_ = req_inst;
  pcStack_20 = path;
  path_local = (char *)data;
  memset(local_b8,0,0x28);
  *_j = (lyd_node *)0x0;
  for (node = (lyd_node *)path_local; node->parent != (lyd_node *)0x0; node = node->parent) {
  }
  if (node->prev != (lyd_node *)0x0) {
    while (node->prev->next != (lyd_node *)0x0) {
      node = node->prev;
    }
  }
  while (pcStack_20[parsed] != '\0') {
    cur_idx = parse_instance_identifier
                        (pcStack_20 + parsed,&name,&has_predicate,&str,(int *)&local_88,
                         (int *)&node_match.diff_idx);
    if (cur_idx < 1) {
      ly_vlog((ly_ctx *)root,LYE_INCHAR,LY_VLOG_LYD,path_local,
              (ulong)(uint)(int)pcStack_20[parsed - cur_idx],pcStack_20 + (parsed - cur_idx));
      goto LAB_001206a7;
    }
    parsed = cur_idx + parsed;
    if (name == (char *)0x0) {
      if (ctx == (ly_ctx *)0x0) {
        ly_vlog((ly_ctx *)root,LYE_INELEM_LEN,LY_VLOG_LYD,path_local,(ulong)local_88,str);
        ly_vlog((ly_ctx *)root,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                "Instance-identifier is missing prefix in the first node.");
        goto LAB_001206a7;
      }
      prev_mod = (lys_module *)ctx;
    }
    else {
      _name_len = strndup(name,(long)has_predicate);
      if (_name_len == (char *)0x0) {
        ly_log((ly_ctx *)root,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","resolve_instid");
        goto LAB_001206a7;
      }
      prev_mod = ly_ctx_get_module((ly_ctx *)root,_name_len,(char *)0x0,1);
      if (root[1].parent != (lyd_node *)0x0) {
        if (prev_mod == (lys_module *)0x0) {
          prev_mod = (lys_module *)
                     (*(code *)root[1].parent)(root,_name_len,0,0,*(undefined8 *)&root[1].hash);
        }
        else if ((*(ushort *)&prev_mod->field_0x40 >> 7 & 1) == 0) {
          prev_mod = (lys_module *)
                     (*(code *)root[1].parent)
                               (root,prev_mod->name,prev_mod->ns,1,*(undefined8 *)&root[1].hash);
        }
      }
      free(_name_len);
      if (((prev_mod == (lys_module *)0x0) || ((*(ushort *)&prev_mod->field_0x40 >> 7 & 1) == 0)) ||
         ((*(ushort *)&prev_mod->field_0x40 >> 6 & 1) != 0)) break;
    }
    iVar1 = resolve_data(prev_mod,str,local_88,node,(unres_data *)local_b8);
    if (iVar1 != 0) break;
    if (node_match.diff_idx == 0) {
      if ((uint)node_match.type != 0) {
        for (cur_idx = 0; iVar1 = cur_idx, (uint)cur_idx < (uint)node_match.type;
            cur_idx = cur_idx + 1) {
          if ((*(lyd_node **)((long)local_b8 + (long)cur_idx * 8))->schema->nodetype == LYS_LIST) {
            cur_idx = cur_idx + -1;
            unres_data_del((unres_data *)local_b8,iVar1);
          }
        }
        if ((uint)node_match.type == 0) {
          ly_vlog((ly_ctx *)root,LYE_SPEC,LY_VLOG_LYD,path_local,
                  "Instance identifier is missing list keys.");
        }
      }
    }
    else {
      cur_idx = 0;
      mod._4_4_ = 0;
      mod._0_4_ = 1;
      while (cur_idx < (int)(uint)node_match.type) {
        model = *(char **)((long)local_b8 + (long)cur_idx * 8);
        mod._4_4_ = resolve_instid_predicate
                              (prev_mod,pcStack_20 + parsed,(lyd_node **)&model,(int)mod);
        if (mod._4_4_ < 1) {
          ly_vlog((ly_ctx *)root,LYE_INPRED,LY_VLOG_LYD,path_local,pcStack_20 + (parsed - mod._4_4_)
                 );
          goto LAB_001206a7;
        }
        if (model == (char *)0x0) {
          unres_data_del((unres_data *)local_b8,cur_idx);
        }
        else {
          cur_idx = cur_idx + 1;
        }
        mod._0_4_ = (int)mod + 1;
      }
      parsed = mod._4_4_ + parsed;
    }
    ctx = (ly_ctx *)prev_mod;
  }
  if ((uint)node_match.type == 0) {
    if (ret_local._4_4_ < 0) {
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
             "There is no instance of \"%s\", but it is not required.",pcStack_20);
      data_local._4_4_ = 0;
    }
    else {
      ly_vlog((ly_ctx *)root,LYE_NOREQINS,LY_VLOG_LYD,path_local,pcStack_20);
      data_local._4_4_ = 1;
    }
  }
  else if ((uint)node_match.type < 2) {
    *_j = *(lyd_node **)local_b8;
    free((void *)local_b8);
    data_local._4_4_ = 0;
  }
  else {
    ly_vlog((ly_ctx *)root,LYE_TOOMANY,LY_VLOG_LYD,path_local,pcStack_20,"data tree");
LAB_001206a7:
    free((void *)local_b8);
    data_local._4_4_ = -1;
  }
  return data_local._4_4_;
}

Assistant:

static int
resolve_instid(struct lyd_node *data, const char *path, int req_inst, struct lyd_node **ret)
{
    int i = 0, j, parsed, cur_idx;
    const struct lys_module *mod, *prev_mod = NULL;
    struct ly_ctx *ctx = data->schema->module->ctx;
    struct lyd_node *root, *node;
    const char *model = NULL, *name;
    char *str;
    int mod_len, name_len, has_predicate;
    struct unres_data node_match;

    memset(&node_match, 0, sizeof node_match);
    *ret = NULL;

    /* we need root to resolve absolute path */
    for (root = data; root->parent; root = root->parent);
    /* we're still parsing it and the pointer is not correct yet */
    if (root->prev) {
        for (; root->prev->next; root = root->prev);
    }

    /* search for the instance node */
    while (path[i]) {
        j = parse_instance_identifier(&path[i], &model, &mod_len, &name, &name_len, &has_predicate);
        if (j <= 0) {
            LOGVAL(ctx, LYE_INCHAR, LY_VLOG_LYD, data, path[i-j], &path[i-j]);
            goto error;
        }
        i += j;

        if (model) {
            str = strndup(model, mod_len);
            if (!str) {
                LOGMEM(ctx);
                goto error;
            }
            mod = ly_ctx_get_module(ctx, str, NULL, 1);
            if (ctx->data_clb) {
                if (!mod) {
                    mod = ctx->data_clb(ctx, str, NULL, 0, ctx->data_clb_data);
                } else if (!mod->implemented) {
                    mod = ctx->data_clb(ctx, mod->name, mod->ns, LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
                }
            }
            free(str);

            if (!mod || !mod->implemented || mod->disabled) {
                break;
            }
        } else if (!prev_mod) {
            /* first iteration and we are missing module name */
            LOGVAL(ctx, LYE_INELEM_LEN, LY_VLOG_LYD, data, name_len, name);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Instance-identifier is missing prefix in the first node.");
            goto error;
        } else {
            mod = prev_mod;
        }

        if (resolve_data(mod, name, name_len, root, &node_match)) {
            /* no instance exists */
            break;
        }

        if (has_predicate) {
            /* we have predicate, so the current results must be list or leaf-list */
            parsed = j = 0;
            /* index of the current node (for lists with position predicates) */
            cur_idx = 1;
            while (j < (signed)node_match.count) {
                node = node_match.node[j];
                parsed = resolve_instid_predicate(mod, &path[i], &node, cur_idx);
                if (parsed < 1) {
                    LOGVAL(ctx, LYE_INPRED, LY_VLOG_LYD, data, &path[i - parsed]);
                    goto error;
                }

                if (!node) {
                    /* current node does not satisfy the predicate */
                    unres_data_del(&node_match, j);
                } else {
                    ++j;
                }
                ++cur_idx;
            }

            i += parsed;
        } else if (node_match.count) {
            /* check that we are not addressing lists */
            for (j = 0; (unsigned)j < node_match.count; ++j) {
                if (node_match.node[j]->schema->nodetype == LYS_LIST) {
                    unres_data_del(&node_match, j--);
                }
            }
            if (!node_match.count) {
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_LYD, data, "Instance identifier is missing list keys.");
            }
        }

        prev_mod = mod;
    }

    if (!node_match.count) {
        /* no instance exists */
        if (req_inst > -1) {
            LOGVAL(ctx, LYE_NOREQINS, LY_VLOG_LYD, data, path);
            return EXIT_FAILURE;
        }
        LOGVRB("There is no instance of \"%s\", but it is not required.", path);
        return EXIT_SUCCESS;
    } else if (node_match.count > 1) {
        /* instance identifier must resolve to a single node */
        LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYD, data, path, "data tree");
        goto error;
    } else {
        /* we have required result, remember it and cleanup */
        *ret = node_match.node[0];
        free(node_match.node);
        return EXIT_SUCCESS;
    }

error:
    /* cleanup */
    free(node_match.node);
    return -1;
}